

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O0

void __thiscall FIX::Trailer::Trailer(Trailer *this)

{
  message_order local_30;
  Trailer *local_10;
  Trailer *this_local;
  
  local_10 = this;
  message_order::message_order(&local_30,trailer);
  FieldMap::FieldMap(&this->super_FieldMap,&local_30,1);
  message_order::~message_order(&local_30);
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__Trailer_003302d0;
  return;
}

Assistant:

Trailer()
      : FieldMap(message_order(message_order::trailer), REQUIRED_FIELDS) {}